

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O0

uint llvm::dwarf::AttributeEncodingVendor(TypeKind ATE)

{
  TypeKind ATE_local;
  
  switch(ATE) {
  case DW_ATE_address:
    break;
  case DW_ATE_boolean:
    break;
  case DW_ATE_complex_float:
    break;
  case DW_ATE_float:
    break;
  case DW_ATE_signed:
    break;
  case DW_ATE_signed_char:
    break;
  case DW_ATE_unsigned:
    break;
  case DW_ATE_unsigned_char:
    break;
  case DW_ATE_imaginary_float:
    break;
  case DW_ATE_packed_decimal:
    break;
  case DW_ATE_numeric_string:
    break;
  case DW_ATE_edited:
    break;
  case DW_ATE_signed_fixed:
    break;
  case DW_ATE_unsigned_fixed:
    break;
  case DW_ATE_decimal_float:
    break;
  case DW_ATE_UTF:
    break;
  case DW_ATE_UCS:
    break;
  case DW_ATE_ASCII:
  }
  return 0;
}

Assistant:

unsigned llvm::dwarf::AttributeEncodingVendor(dwarf::TypeKind ATE) {
  switch (ATE) {
  default:
    return 0;
#define HANDLE_DW_ATE(ID, NAME, VERSION, VENDOR)                               \
  case DW_ATE_##NAME:                                                          \
    return DWARF_VENDOR_##VENDOR;
#include "llvm/BinaryFormat/Dwarf.def"
  }
}